

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O1

void ncnn::im2col_sgemm_pack1to4_int8_sse_xop
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int *piVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  undefined1 *puVar12;
  uint _h;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  undefined1 (*pauVar17) [16];
  uint uVar18;
  long lVar19;
  ulong *puVar20;
  size_t _elemsize;
  undefined1 *puVar21;
  long lVar22;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  int iVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  Mat local_b8;
  ulong local_70;
  Mat *local_68;
  ulong local_60;
  ulong local_58;
  Mat *local_50;
  Mat *local_48;
  ulong local_40;
  ulong local_38;
  undefined1 auVar32 [64];
  undefined1 auVar34 [64];
  
  uVar1 = bottom_im2col->w;
  uVar18 = bottom_im2col->h;
  uVar30 = (ulong)uVar18;
  uVar2 = bottom_im2col->c;
  lVar29 = (long)(int)uVar2;
  local_58 = (ulong)(uint)top_blob->c;
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize = 0;
  local_b8.elempack = 0;
  local_b8.allocator = (Allocator *)0x0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  uVar16 = uVar18;
  uVar8 = uVar1;
  if (lVar29 < 4) {
    iVar10 = 1;
    _elemsize = 1;
    _h = uVar2;
    if (1 < (int)uVar1) {
      uVar16 = uVar18 * 2;
      uVar8 = (uVar1 & 1) + (uVar1 >> 1);
      iVar10 = 1;
    }
  }
  else if ((int)uVar1 < 2) {
    iVar10 = 4;
    _elemsize = 4;
    _h = (uVar2 & 3) + (uVar2 >> 2);
  }
  else {
    _elemsize = 4;
    uVar16 = uVar18 * 2;
    _h = (uVar2 & 3) + (uVar2 >> 2);
    uVar8 = (uVar1 & 1) + (uVar1 >> 1);
    iVar10 = 4;
  }
  local_50 = top_blob;
  local_48 = kernel;
  Mat::create(&local_b8,uVar16,_h,uVar8,_elemsize,iVar10,opt->workspace_allocator);
  local_70 = (ulong)uVar2;
  uVar9 = (ulong)(int)uVar1;
  if (0 < (int)uVar1 >> 1) {
    local_40 = (ulong)(uint)((int)uVar1 >> 1);
    lVar15 = 1;
    uVar14 = 0;
    do {
      puVar21 = (undefined1 *)(local_b8.cstep * uVar14 * local_b8.elemsize + (long)local_b8.data);
      if ((int)uVar2 < 4) {
        uVar23 = 0;
      }
      else {
        lVar22 = 3;
        lVar26 = 1;
        lVar27 = 2;
        uVar13 = 0;
        do {
          if (0 < (int)uVar18) {
            lVar11 = bottom_im2col->elemsize * bottom_im2col->cstep;
            lVar19 = (long)bottom_im2col->data + lVar15;
            uVar23 = uVar30;
            do {
              *puVar21 = *(undefined1 *)(lVar19 + -1 + lVar11 * uVar13);
              puVar21[1] = *(undefined1 *)(lVar19 + -1 + lVar11 * lVar26);
              puVar21[2] = *(undefined1 *)(lVar19 + -1 + lVar11 * lVar27);
              puVar21[3] = *(undefined1 *)(lVar19 + -1 + lVar11 * lVar22);
              puVar21[4] = *(undefined1 *)(lVar19 + lVar11 * uVar13);
              puVar21[5] = *(undefined1 *)(lVar19 + lVar11 * lVar26);
              puVar21[6] = *(undefined1 *)(lVar19 + lVar11 * lVar27);
              puVar21[7] = *(undefined1 *)(lVar19 + lVar11 * lVar22);
              puVar21 = puVar21 + 8;
              lVar19 = lVar19 + uVar9;
              uVar16 = (int)uVar23 - 1;
              uVar23 = (ulong)uVar16;
            } while (uVar16 != 0);
          }
          uVar23 = uVar13 + 4;
          lVar11 = uVar13 + 7;
          lVar22 = lVar22 + 4;
          lVar26 = lVar26 + 4;
          lVar27 = lVar27 + 4;
          uVar13 = uVar23;
          local_38 = uVar14;
        } while (lVar11 < lVar29);
      }
      if ((int)uVar23 < (int)uVar2) {
        uVar23 = uVar23 & 0xffffffff;
        do {
          if (0 < (int)uVar18) {
            lVar22 = bottom_im2col->cstep * bottom_im2col->elemsize * uVar23;
            lVar26 = (long)bottom_im2col->data + lVar15;
            uVar13 = uVar30;
            do {
              *puVar21 = *(undefined1 *)(lVar26 + -1 + lVar22);
              puVar21[1] = *(undefined1 *)(lVar26 + lVar22);
              puVar21 = puVar21 + 2;
              lVar26 = lVar26 + uVar9;
              uVar16 = (int)uVar13 - 1;
              uVar13 = (ulong)uVar16;
            } while (uVar16 != 0);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != local_70);
      }
      uVar14 = uVar14 + 1;
      lVar15 = lVar15 + 2;
    } while (uVar14 != local_40);
  }
  uVar14 = uVar9 & 0xfffffffffffffffe;
  if ((uint)uVar14 != uVar1) {
    do {
      uVar16 = ((uint)(uVar14 >> 0x1f) & 1) + (int)uVar14;
      puVar21 = (undefined1 *)
                (local_b8.elemsize * local_b8.cstep *
                 (long)(int)(((int)uVar16 >> 1) + ((int)uVar14 - (uVar16 & 0xfffffffe))) +
                (long)local_b8.data);
      if ((int)uVar2 < 4) {
        uVar23 = 0;
      }
      else {
        lVar15 = 1;
        lVar22 = 2;
        lVar26 = 3;
        uVar13 = 0;
        do {
          if (0 < (int)uVar18) {
            lVar27 = bottom_im2col->elemsize * bottom_im2col->cstep;
            lVar11 = (long)bottom_im2col->data + uVar14;
            uVar23 = uVar30;
            do {
              *puVar21 = *(undefined1 *)(lVar11 + lVar27 * uVar13);
              puVar21[1] = *(undefined1 *)(lVar11 + lVar27 * lVar15);
              puVar21[2] = *(undefined1 *)(lVar11 + lVar27 * lVar22);
              puVar21[3] = *(undefined1 *)(lVar11 + lVar27 * lVar26);
              puVar21 = puVar21 + 4;
              lVar11 = lVar11 + uVar9;
              uVar16 = (int)uVar23 - 1;
              uVar23 = (ulong)uVar16;
            } while (uVar16 != 0);
          }
          uVar23 = uVar13 + 4;
          lVar27 = uVar13 + 7;
          lVar15 = lVar15 + 4;
          lVar22 = lVar22 + 4;
          lVar26 = lVar26 + 4;
          uVar13 = uVar23;
        } while (lVar27 < lVar29);
      }
      if ((int)uVar23 < (int)uVar2) {
        uVar23 = uVar23 & 0xffffffff;
        do {
          if (0 < (int)uVar18) {
            puVar12 = (undefined1 *)
                      ((long)bottom_im2col->data +
                      uVar14 + bottom_im2col->cstep * uVar23 * bottom_im2col->elemsize);
            uVar13 = uVar30;
            do {
              *puVar21 = *puVar12;
              puVar21 = puVar21 + 1;
              puVar12 = puVar12 + uVar9;
              uVar16 = (int)uVar13 - 1;
              uVar13 = (ulong)uVar16;
            } while (uVar16 != 0);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != local_70);
      }
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < (long)uVar9);
  }
  if (0 < (int)local_58) {
    uVar16 = uVar2 + 3;
    if (-1 < (int)uVar2) {
      uVar16 = uVar2;
    }
    iVar10 = ((int)uVar16 >> 2) * uVar18;
    iVar28 = ((int)uVar2 % 4) * uVar18;
    uVar14 = 0;
    do {
      pauVar17 = (undefined1 (*) [16])
                 (local_50->cstep * uVar14 * local_50->elemsize + (long)local_50->data);
      if ((int)uVar1 < 2) {
        uVar23 = 0;
      }
      else {
        uVar13 = 0;
        do {
          puVar20 = (ulong *)((uVar13 >> 1) * local_b8.cstep * local_b8.elemsize +
                             (long)local_b8.data);
          pauVar24 = (undefined1 (*) [16])
                     (local_48->cstep * uVar14 * local_48->elemsize + (long)local_48->data);
          auVar32 = ZEXT1664((undefined1  [16])0x0);
          auVar31 = (undefined1  [16])0x0;
          if (0 < iVar10) {
            auVar31._8_8_ = 0;
            auVar31._0_8_ = *puVar20;
            auVar3 = vpmovsxbw_avx(auVar31);
            auVar31 = *pauVar24;
            auVar33 = vpcmpgtb_avx((undefined1  [16])0x0,auVar31);
            vpunpcklbw_avx(auVar31,auVar33);
            vpunpckhbw_avx(auVar31,auVar33);
            vpshufd_avx(auVar3,0x44);
            halt_baddata();
          }
          auVar34 = ZEXT1664((undefined1  [16])0x0);
          auVar33 = (undefined1  [16])0x0;
          if (0 < iVar28) {
            lVar29 = 0;
            do {
              auVar31 = vpmovsxbw_avx(ZEXT216(*(ushort *)((long)puVar20 + lVar29 * 2)));
              auVar31 = vpshuflw_avx(auVar31,0x50);
              auVar4 = vpshufd_avx(auVar31,0x50);
              auVar33._8_8_ = 0;
              auVar33._0_8_ = *(ulong *)(*pauVar24 + lVar29 * 4);
              auVar31 = vpmovsxbw_avx(auVar33);
              auVar31 = vpshufd_avx(auVar31,0x44);
              auVar3 = vpmullw_avx(auVar4,auVar31);
              auVar31 = vpmulhw_avx(auVar4,auVar31);
              auVar33 = vpunpcklwd_avx(auVar3,auVar31);
              auVar33 = vpaddd_avx(auVar34._0_16_,auVar33);
              auVar34 = ZEXT1664(auVar33);
              auVar31 = vpunpckhwd_avx(auVar3,auVar31);
              auVar31 = vpaddd_avx(auVar32._0_16_,auVar31);
              auVar32 = ZEXT1664(auVar31);
              lVar29 = lVar29 + 1;
            } while (iVar28 != (int)lVar29);
          }
          *pauVar17 = auVar33;
          pauVar17[1] = auVar31;
          pauVar17 = pauVar17 + 2;
          uVar23 = uVar13 + 2;
          lVar29 = uVar13 + 3;
          uVar13 = uVar23;
        } while (lVar29 < (long)uVar9);
      }
      if ((int)uVar23 < (int)uVar1) {
        do {
          puVar20 = (ulong *)((((uint)uVar23 & 1) + ((uint)(uVar23 >> 1) & 0x7fffffff)) *
                              local_b8.cstep * local_b8.elemsize + (long)local_b8.data);
          pauVar24 = (undefined1 (*) [16])
                     (local_48->cstep * uVar14 * local_48->elemsize + (long)local_48->data);
          auVar32 = ZEXT1664((undefined1  [16])0x0);
          if (0 < iVar10) {
            auVar34 = ZEXT1664((undefined1  [16])0x0);
            auVar35 = ZEXT1664((undefined1  [16])0x0);
            auVar36 = ZEXT1664((undefined1  [16])0x0);
            iVar25 = iVar10;
            do {
              auVar3._8_8_ = 0;
              auVar3._0_8_ = *puVar20;
              auVar3 = vpmovsxbw_avx(auVar3);
              auVar31 = *pauVar24;
              auVar33 = vpcmpgtb_avx((undefined1  [16])0x0,auVar31);
              auVar5 = vpunpcklbw_avx(auVar31,auVar33);
              auVar4 = vpunpckhbw_avx(auVar31,auVar33);
              auVar31 = vpshufd_avx(auVar3,0x44);
              auVar3 = vpmullw_avx(auVar5,auVar31);
              auVar33 = vpmulhw_avx(auVar5,auVar31);
              auVar5 = vpmullw_avx(auVar31,auVar4);
              auVar4 = vpmulhw_avx(auVar31,auVar4);
              auVar31 = vpunpcklwd_avx(auVar3,auVar33);
              auVar31 = vpaddd_avx(auVar36._0_16_,auVar31);
              auVar36 = ZEXT1664(auVar31);
              auVar33 = vpunpckhwd_avx(auVar3,auVar33);
              auVar33 = vpaddd_avx(auVar35._0_16_,auVar33);
              auVar35 = ZEXT1664(auVar33);
              auVar3 = vpunpcklwd_avx(auVar5,auVar4);
              auVar3 = vpaddd_avx(auVar34._0_16_,auVar3);
              auVar34 = ZEXT1664(auVar3);
              auVar4 = vpunpckhwd_avx(auVar5,auVar4);
              auVar4 = vpaddd_avx(auVar32._0_16_,auVar4);
              auVar32 = ZEXT1664(auVar4);
              puVar20 = (ulong *)((long)puVar20 + 4);
              pauVar24 = pauVar24 + 1;
              iVar25 = iVar25 + -1;
            } while (iVar25 != 0);
            auVar5 = vpunpckldq_avx(auVar31,auVar33);
            auVar6 = vpunpckldq_avx(auVar3,auVar4);
            auVar33 = vpunpckhdq_avx(auVar31,auVar33);
            auVar3 = vpunpckhdq_avx(auVar3,auVar4);
            auVar4 = vpunpcklqdq_avx(auVar5,auVar6);
            auVar31 = vpunpckhqdq_avx(auVar5,auVar6);
            auVar31 = vpaddd_avx(auVar4,auVar31);
            auVar4 = vpunpcklqdq_avx(auVar33,auVar3);
            auVar33 = vpunpckhqdq_avx(auVar33,auVar3);
            auVar33 = vpaddd_avx(auVar33,auVar4);
            auVar31 = vpaddd_avx(auVar31,auVar33);
            auVar32 = ZEXT1664(auVar31);
          }
          auVar31 = auVar32._0_16_;
          if (0 < iVar28) {
            lVar29 = 0;
            do {
              auVar31 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)puVar20 + lVar29)),0);
              auVar3 = vpshufd_avx(auVar31,0);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)(*pauVar24 + lVar29 * 4);
              auVar31 = vpmovsxbw_avx(auVar4);
              auVar33 = vpmullw_avx(auVar3,auVar31);
              auVar31 = vpmulhw_avx(auVar3,auVar31);
              auVar31 = vpunpcklwd_avx(auVar33,auVar31);
              auVar31 = vpaddd_avx(auVar32._0_16_,auVar31);
              auVar32 = ZEXT1664(auVar31);
              lVar29 = lVar29 + 1;
            } while (iVar28 != (int)lVar29);
          }
          *pauVar17 = auVar31;
          pauVar17 = pauVar17 + 1;
          uVar18 = (uint)uVar23 + 1;
          uVar23 = (ulong)uVar18;
        } while (uVar18 != uVar1);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != local_58);
  }
  piVar7 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      local_68 = bottom_im2col;
      local_60 = uVar30;
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack1to4_int8_sse_xop(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack1to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}